

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgparserutils.h
# Opt level: O1

bool lunasvg::parseNumber<float>(string_view *input,float *number)

{
  byte *pbVar1;
  ulong uVar2;
  byte *pbVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  float fVar10;
  double dVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  sVar6 = input->_M_len;
  if (sVar6 == 0) {
    fVar10 = 1.0;
  }
  else {
    pcVar9 = input->_M_str;
    if (*pcVar9 == '+') {
      fVar10 = 1.0;
    }
    else {
      fVar10 = 1.0;
      if ((sVar6 == 0) || (pcVar9 = input->_M_str, fVar10 = 1.0, *pcVar9 != '-')) goto LAB_00117396;
      fVar10 = -1.0;
    }
    input->_M_str = pcVar9 + 1;
    input->_M_len = sVar6 - 1;
  }
LAB_00117396:
  if ((input->_M_len == 0) ||
     (uVar4 = (int)*input->_M_str - 0x30, *input->_M_str != 0x2e && 9 < uVar4)) {
LAB_001175bc:
    uVar4 = 0;
  }
  else {
    fVar13 = 0.0;
    fVar12 = 0.0;
    if (uVar4 < 10) {
      sVar6 = input->_M_len;
      pcVar9 = input->_M_str;
      do {
        sVar6 = sVar6 - 1;
        pcVar8 = pcVar9 + 1;
        fVar12 = fVar12 * 10.0 + (float)(*pcVar9 + -0x30);
        input->_M_str = pcVar8;
        input->_M_len = sVar6;
        if (sVar6 == 0) break;
        pcVar9 = pcVar8;
      } while ((int)*pcVar8 - 0x30U < 10);
    }
    if ((input->_M_len != 0) && (*input->_M_str == '.')) {
      pcVar9 = input->_M_str + 1;
      input->_M_str = pcVar9;
      sVar6 = input->_M_len - 1;
      input->_M_len = sVar6;
      if ((sVar6 == 0) || (9 < (int)*pcVar9 - 0x30U)) goto LAB_001175bc;
      sVar6 = input->_M_len;
      fVar14 = 1.0;
      fVar13 = 0.0;
      pcVar9 = input->_M_str;
      do {
        sVar6 = sVar6 - 1;
        pcVar8 = pcVar9 + 1;
        fVar13 = fVar13 * 10.0 + (float)(*pcVar9 + -0x30);
        fVar14 = fVar14 * 10.0;
        input->_M_str = pcVar8;
        input->_M_len = sVar6;
        if (sVar6 == 0) break;
        pcVar9 = pcVar8;
      } while ((int)*pcVar8 - 0x30U < 10);
      fVar13 = fVar13 / fVar14;
    }
    uVar2 = input->_M_len;
    iVar5 = 1;
    iVar7 = 1;
    uVar4 = 0;
    if ((((1 < uVar2) && (pbVar3 = (byte *)input->_M_str, uVar4 = 0, (*pbVar3 | 0x20) == 0x65)) &&
        (uVar4 = 0, pbVar3[1] != 0x6d)) && (pbVar3[1] != 0x78)) {
      pbVar1 = pbVar3 + 1;
      input->_M_str = (char *)pbVar1;
      sVar6 = uVar2 - 1;
      input->_M_len = sVar6;
      iVar7 = iVar5;
      if ((sVar6 != 0) &&
         ((iVar5 = 1, *pbVar1 == 0x2b || ((sVar6 != 0 && (iVar5 = -1, *pbVar1 == 0x2d)))))) {
        input->_M_str = (char *)(pbVar3 + 2);
        input->_M_len = uVar2 - 2;
        iVar7 = iVar5;
      }
      if (input->_M_len == 0) goto LAB_001175bc;
      uVar4 = 0;
      if (9 < (int)*input->_M_str - 0x30U) goto LAB_001175be;
      sVar6 = input->_M_len;
      pcVar9 = input->_M_str;
      do {
        sVar6 = sVar6 - 1;
        pcVar8 = pcVar9 + 1;
        uVar4 = ((int)*pcVar9 + uVar4 * 10) - 0x30;
        input->_M_str = pcVar8;
        input->_M_len = sVar6;
        if (sVar6 == 0) break;
        pcVar9 = pcVar8;
      } while ((int)*pcVar8 - 0x30U < 10);
    }
    *number = fVar10 * (fVar12 + fVar13);
    if (uVar4 != 0) {
      dVar11 = pow(10.0,(double)(int)(iVar7 * uVar4));
      *number = (float)dVar11 * *number;
    }
    uVar4 = (uint)(ABS(*number) <= 3.4028235e+38);
  }
LAB_001175be:
  return SUB41(uVar4,0);
}

Assistant:

inline bool parseNumber(std::string_view& input, T& number)
{
    constexpr T maxValue = std::numeric_limits<T>::max();
    T integer = 0;
    T fraction = 0;
    int exponent = 0;
    int sign = 1;
    int expsign = 1;

    if(!input.empty() && input.front() == '+') {
        input.remove_prefix(1);
    } else if(!input.empty() && input.front() == '-') {
        input.remove_prefix(1);
        sign = -1;
    }

    if(input.empty() || (!IS_NUM(input.front()) && input.front() != '.'))
        return false;
    if(IS_NUM(input.front())) {
        do {
            integer = static_cast<T>(10) * integer + (input.front() - '0');
            input.remove_prefix(1);
        } while(!input.empty() && IS_NUM(input.front()));
    }

    if(!input.empty() && input.front() == '.') {
        input.remove_prefix(1);
        if(input.empty() || !IS_NUM(input.front()))
            return false;
        T divisor = static_cast<T>(1);
        do {
            fraction = static_cast<T>(10) * fraction + (input.front() - '0');
            divisor *= static_cast<T>(10);
            input.remove_prefix(1);
        } while(!input.empty() && IS_NUM(input.front()));
        fraction /= divisor;
    }

    if(input.size() > 1 && (input[0] == 'e' || input[0] == 'E')
        && (input[1] != 'x' && input[1] != 'm'))
    {
        input.remove_prefix(1);
        if(!input.empty() && input.front() == '+')
            input.remove_prefix(1);
        else if(!input.empty() && input.front() == '-') {
            input.remove_prefix(1);
            expsign = -1;
        }

        if(input.empty() || !IS_NUM(input.front()))
            return false;
        do {
            exponent = 10 * exponent + (input.front() - '0');
            input.remove_prefix(1);
        } while(!input.empty() && IS_NUM(input.front()));
    }

    number = sign * (integer + fraction);
    if(exponent)
        number *= static_cast<T>(std::pow(10.0, expsign * exponent));
    return number >= -maxValue && number <= maxValue;
}